

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::FindPreviousWord
          (string *__return_storage_ptr__,Parser *this,size_t pos,bool withComments,string *buffer)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  string stream;
  string store;
  
  std::__cxx11::string::string((string *)&stream,(string *)buffer);
  if (buffer->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&stream);
    if (withComments) {
      std::__cxx11::string::_M_assign((string *)&stream);
    }
  }
  lVar4 = -pos;
  for (pcVar6 = stream._M_dataplus._M_p + pos;
      ((cVar1 = *pcVar6, cVar1 != ' ' && (lVar4 != 0)) && (cVar1 != '\r')); pcVar6 = pcVar6 + -1) {
    lVar4 = lVar4 + 1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&store);
  lVar4 = (ulong)(1 < (ulong)-lVar4 && cVar1 == '\r') + lVar4;
  lVar5 = 1 - lVar4;
  lVar4 = -lVar4;
  bVar2 = true;
  bVar3 = 0;
  do {
    bVar7 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if ((bVar7) || (!bVar2)) {
      std::__cxx11::string::~string((string *)&stream);
      return __return_storage_ptr__;
    }
    cVar1 = stream._M_dataplus._M_p[lVar4];
    if (cVar1 == '\n') {
LAB_0011c5c6:
      bVar2 = (bool)(bVar3 ^ 1);
    }
    else if (cVar1 == '\r') {
      bVar2 = true;
    }
    else {
      if (cVar1 == ' ') goto LAB_0011c5c6;
      std::__cxx11::string::string((string *)&store,(string *)__return_storage_ptr__);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,stream._M_dataplus._M_p[lVar4]);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&store);
      bVar2 = true;
      bVar3 = 1;
    }
    lVar4 = lVar4 + -1;
  } while( true );
}

Assistant:

std::string Parser::FindPreviousWord(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  size_t i=pos;

  while(stream[i] != ' ' && stream[i] != '\r' && i>0)
    {
    i--;
    }

  if(stream[i] == '\r' && i>1)
    {
    i--;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i != std::string::npos && inWord)
    {
    if(stream[i] != ' ' && stream[i] != '\n' && stream[i] != '\r')
      {
      std::string store = ivar;
      ivar = stream[i];
      ivar += store;
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(stream[i] == '\r')
        {
        // do nothing
        }
      else if(first)
        {
        inWord = false;
        }
      }
    i--;
    }
  return ivar;
}